

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

void __thiscall Camera::Control(Camera *this,GLFWwindow *window,float delta)

{
  int iVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  dvec2 cur_pos;
  anon_union_8_3_4e90da17_for_vec<2,_double,_(glm::qualifier)0>_3 local_30;
  anon_union_8_3_4e90b0ec_for_vec<2,_double,_(glm::qualifier)0>_5 aStack_28;
  
  glfwGetCursorPos(window,&local_30.x,&aStack_28.y);
  pIVar2 = ImGui::GetCurrentContext();
  if (pIVar2->NavWindow != (ImGuiWindow *)0x0) {
    pIVar2 = ImGui::GetCurrentContext();
    if ((pIVar2->NavWindow->Flags & 0x2000) == 0) goto LAB_0011d961;
  }
  fVar3 = delta * this->m_speed;
  iVar1 = glfwGetKey(window,0x57);
  if (iVar1 == 1) {
    fVar4 = sinf(this->m_yaw + 0.0);
    (this->m_position).field_0.x = fVar4 * fVar3 + (this->m_position).field_0.x;
    fVar4 = cosf(this->m_yaw + 0.0);
    (this->m_position).field_2.z = fVar4 * fVar3 + (this->m_position).field_2.z;
  }
  iVar1 = glfwGetKey(window,0x41);
  if (iVar1 == 1) {
    fVar4 = sinf(this->m_yaw + 1.5707964);
    (this->m_position).field_0.x = fVar4 * fVar3 + (this->m_position).field_0.x;
    fVar4 = cosf(this->m_yaw + 1.5707964);
    (this->m_position).field_2.z = fVar4 * fVar3 + (this->m_position).field_2.z;
  }
  iVar1 = glfwGetKey(window,0x44);
  if (iVar1 == 1) {
    fVar4 = sinf(this->m_yaw + -1.5707964);
    (this->m_position).field_0.x = fVar4 * fVar3 + (this->m_position).field_0.x;
    fVar4 = cosf(this->m_yaw + -1.5707964);
    (this->m_position).field_2.z = fVar4 * fVar3 + (this->m_position).field_2.z;
  }
  iVar1 = glfwGetKey(window,0x53);
  if (iVar1 == 1) {
    fVar4 = sinf(this->m_yaw + 3.1415927);
    (this->m_position).field_0.x = fVar4 * fVar3 + (this->m_position).field_0.x;
    fVar4 = cosf(this->m_yaw + 3.1415927);
    (this->m_position).field_2.z = fVar4 * fVar3 + (this->m_position).field_2.z;
  }
  iVar1 = glfwGetKey(window,0x20);
  if (iVar1 == 1) {
    (this->m_position).field_1.y = (this->m_position).field_1.y + fVar3;
  }
  iVar1 = glfwGetKey(window,0x154);
  if (iVar1 == 1) {
    (this->m_position).field_1.y = (this->m_position).field_1.y - fVar3;
  }
  iVar1 = glfwGetMouseButton(window,0);
  if (iVar1 != 0) {
    glfwGetCursorPos(window,&local_30.x,&aStack_28.y);
    fVar5 = this->m_yaw -
            (float)(local_30.x - (this->m_last_mouse_pos).field_0.x) * this->m_sensitivity;
    fVar4 = this->m_pitch -
            (float)(aStack_28.y - (this->m_last_mouse_pos).field_1.y) * this->m_sensitivity;
    fVar3 = -1.5707964;
    if (-1.5707964 <= fVar4) {
      fVar3 = fVar4;
    }
    fVar4 = 1.5707964;
    if (fVar3 <= 1.5707964) {
      fVar4 = fVar3;
    }
    this->m_pitch = fVar4;
    fVar3 = floorf(fVar5 / 6.2831855);
    this->m_yaw = fVar5 - fVar3 * 6.2831855;
  }
LAB_0011d961:
  (this->m_last_mouse_pos).field_0 = local_30;
  (this->m_last_mouse_pos).field_1 = aStack_28;
  return;
}

Assistant:

void Camera::Control(GLFWwindow *window, float delta) {
	glm::dvec2 cur_pos;
	glfwGetCursorPos(window, &cur_pos.x, &cur_pos.y);

	if (!ImGui::GetCurrentContext()->NavWindow ||
	    (ImGui::GetCurrentContext()->NavWindow->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) {
		float speed = delta * m_speed;
		if (glfwGetKey(window, GLFW_KEY_W) == GLFW_PRESS)
			move_forward(speed, 0.0f);
		if (glfwGetKey(window, GLFW_KEY_A) == GLFW_PRESS)
			move_forward(speed, PIF * 0.5f);
		if (glfwGetKey(window, GLFW_KEY_D) == GLFW_PRESS)
			move_forward(speed, -PIF * 0.5f);
		if (glfwGetKey(window, GLFW_KEY_S) == GLFW_PRESS)
			move_forward(speed, PIF);
		if (glfwGetKey(window, GLFW_KEY_SPACE) == GLFW_PRESS)
			m_position.y += speed;
		if (glfwGetKey(window, GLFW_KEY_LEFT_SHIFT) == GLFW_PRESS)
			m_position.y -= speed;

		if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT)) {
			glfwGetCursorPos(window, &cur_pos.x, &cur_pos.y);
			float offset_x = float(cur_pos.x - m_last_mouse_pos.x) * m_sensitivity;
			float offset_y = float(cur_pos.y - m_last_mouse_pos.y) * m_sensitivity;

			m_yaw -= offset_x;
			m_pitch -= offset_y;

			m_pitch = glm::clamp(m_pitch, -PIF * 0.5f, PIF * 0.5f);
			m_yaw = glm::mod(m_yaw, PIF * 2);
		}
	}
	m_last_mouse_pos = cur_pos;
}